

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void StoreCompressedMetaBlockHeader
               (int is_final_block,size_t length,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = *storage_ix;
  *(ulong *)(storage + (uVar1 >> 3)) =
       (long)is_final_block << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
  uVar2 = uVar1 + 1;
  *storage_ix = uVar2;
  if (is_final_block == 0) {
    uVar3 = (int)length - 1;
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
    if (length == 1) {
      uVar4 = 1;
    }
    uVar5 = 4;
    if (0xf < uVar4) {
      uVar5 = (ulong)(uVar4 + 3 >> 2);
    }
    *(ulong *)(storage + (uVar2 >> 3)) = uVar5 - 4 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3]
    ;
    uVar2 = uVar1 + 3;
    *storage_ix = uVar2;
    *(size_t *)(storage + (uVar2 >> 3)) =
         length - 1 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
    uVar2 = uVar1 + uVar5 * 4 + 3;
    *storage_ix = uVar2;
    uVar2 = uVar2 >> 3;
    *(ulong *)(storage + uVar2) = (ulong)storage[uVar2];
  }
  else {
    *(ulong *)(storage + (uVar2 >> 3)) = (ulong)storage[uVar2 >> 3];
    uVar2 = uVar1 + 2;
    uVar3 = (int)length - 1;
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
    if (length == 1) {
      uVar4 = 1;
    }
    *storage_ix = uVar2;
    uVar5 = 4;
    if (0xf < uVar4) {
      uVar5 = (ulong)(uVar4 + 3 >> 2);
    }
    *(ulong *)(storage + (uVar2 >> 3)) = uVar5 - 4 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3]
    ;
    uVar2 = uVar1 + 4;
    *storage_ix = uVar2;
    *(size_t *)(storage + (uVar2 >> 3)) =
         length - 1 << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  }
  *storage_ix = uVar1 + uVar5 * 4 + 4;
  return;
}

Assistant:

static void StoreCompressedMetaBlockHeader(BROTLI_BOOL is_final_block,
                                           size_t length,
                                           size_t* storage_ix,
                                           uint8_t* storage) {
  uint64_t lenbits;
  size_t nlenbits;
  uint64_t nibblesbits;

  /* Write ISLAST bit. */
  BrotliWriteBits(1, (uint64_t)is_final_block, storage_ix, storage);
  /* Write ISEMPTY bit. */
  if (is_final_block) {
    BrotliWriteBits(1, 0, storage_ix, storage);
  }

  BrotliEncodeMlen(length, &lenbits, &nlenbits, &nibblesbits);
  BrotliWriteBits(2, nibblesbits, storage_ix, storage);
  BrotliWriteBits(nlenbits, lenbits, storage_ix, storage);

  if (!is_final_block) {
    /* Write ISUNCOMPRESSED bit. */
    BrotliWriteBits(1, 0, storage_ix, storage);
  }
}